

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O1

void rect(double x,double y,double w,double h)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(w + x,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(w + x,h + y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,h + y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  return;
}

Assistant:

static void rect(double x, double y, double w, double h) {
  double r = x+w;
  double t = y+h;
  fl_begin_polygon();
  fl_vertex(x, y);
  fl_vertex(r, y);
  fl_vertex(r, t);
  fl_vertex(x, t);
  fl_end_polygon();
}